

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_data.cpp
# Opt level: O2

void __thiscall
ximu::RegisterData::RegisterData(RegisterData *this,unsigned_short address,unsigned_short value)

{
  this->_value = value;
  if (value < 0x71) {
    this->_address = (uint)address;
  }
  return;
}

Assistant:

RegisterData::RegisterData(unsigned short address,
                           unsigned short value)
    :
    _value(value) {
  // check if address falls within the enum
  if (Utility::isWithinInclIncl(
          reg::RegisterAddresses::FIRMWARE_VERSION_MAJOR_NUM,
          reg::RegisterAddresses::NUM_REGISTERS,
          value)
      ) {
    _address = static_cast<reg::RegisterAddresses>(address);
  }
}